

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void issue208b(void)

{
  roaring_bitmap_t *r;
  uint64_t uVar1;
  uint32_t i;
  uint32_t uVar2;
  
  r = roaring_bitmap_create_with_capacity(0);
  uVar2 = 0xffc0;
  do {
    roaring_bitmap_add(r,uVar2);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x10000);
  uVar2 = 0xfffffffe;
  do {
    uVar2 = uVar2 + 2;
    roaring_bitmap_add(r,uVar2);
  } while (uVar2 < 0x2002);
  uVar2 = 0xffc0;
  do {
    uVar1 = roaring_bitmap_rank(r,uVar2);
    _assert_true((ulong)(uVar2 - 0xefbd == (int)uVar1),"rank == expected",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x147);
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x10000);
  roaring_bitmap_free(r);
  return;
}

Assistant:

bool roaring_iterator_sumall(uint32_t value, void *param) {
    *(uint32_t *)param += value;
    return true;  // continue till the end
}